

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::extend<2ul,int,long,(wasm::LaneOrder)0>
          (Literal *__return_storage_ptr__,wasm *this,Literal *vec)

{
  int32_t iVar1;
  reference this_00;
  reference this_01;
  Literal local_e0;
  size_t local_c8;
  size_t idx;
  size_t i;
  undefined1 local_a8 [8];
  LaneArray<2UL> result;
  LaneArray<2UL_*_2> lanes;
  Literal *vec_local;
  
  getLanes<int,4>((LaneArray<4> *)&result._M_elems[1].type,this,vec);
  std::array<wasm::Literal,_2UL>::array((array<wasm::Literal,_2UL> *)local_a8);
  for (idx = 0; idx < 2; idx = idx + 1) {
    local_c8 = idx;
    this_00 = std::array<wasm::Literal,_4UL>::operator[]
                        ((array<wasm::Literal,_4UL> *)&result._M_elems[1].type,idx);
    iVar1 = Literal::geti32(this_00);
    Literal::Literal(&local_e0,(long)iVar1);
    this_01 = std::array<wasm::Literal,_2UL>::operator[]((array<wasm::Literal,_2UL> *)local_a8,idx);
    Literal::operator=(this_01,&local_e0);
    Literal::~Literal(&local_e0);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<2> *)local_a8);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_a8);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&result._M_elems[1].type);
  return __return_storage_ptr__;
}

Assistant:

Literal extend(const Literal& vec) {
  LaneArray<Lanes* 2> lanes = getLanes<LaneFrom, Lanes * 2>(vec);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lanes[idx].geti32());
  }
  return Literal(result);
}